

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_delete(ImGuiInputTextState *str,STB_TexteditState *state,int where,int len)

{
  long in_RSI;
  STB_TexteditState *in_RDI;
  
  stb_text_makeundo_delete
            ((ImGuiInputTextState *)CONCAT44(where,len),in_RDI,(int)((ulong)in_RSI >> 0x20),
             (int)in_RSI);
  STB_TEXTEDIT_DELETECHARS
            ((ImGuiInputTextState *)CONCAT44(where,len),(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  *(undefined1 *)(in_RSI + 0x16) = 0;
  return;
}

Assistant:

static void stb_textedit_delete(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int len)
{
   stb_text_makeundo_delete(str, state, where, len);
   STB_TEXTEDIT_DELETECHARS(str, where, len);
   state->has_preferred_x = 0;
}